

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_generator_x86.cpp
# Opt level: O1

void __thiscall
defyx::AssemblyGeneratorX86::h_CBRANCH(AssemblyGeneratorX86 *this,Instruction *instr,int i)

{
  undefined1 *this_00;
  int *piVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  char *__s;
  byte bVar5;
  size_t sVar6;
  long *plVar7;
  ostream *poVar8;
  long lVar9;
  
  bVar2 = instr->dst;
  bVar5 = instr->mod >> 4;
  iVar3 = this->registerUsage[bVar2];
  uVar4 = instr->imm32;
  this_00 = &this->field_0x10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\tadd ",5);
  __s = *(char **)(regR + (ulong)bVar2 * 8);
  sVar6 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,__s,sVar6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
  plVar7 = (long *)std::ostream::operator<<(this_00,~(0x80 << bVar5) & (0x100 << bVar5 | uVar4));
  std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
  std::ostream::put((char)plVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\ttest ",6);
  sVar6 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,__s,sVar6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\tjz defyx_isn_",0xe);
  plVar7 = (long *)std::ostream::operator<<(this_00,iVar3 + 1);
  std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
  std::ostream::put((char)plVar7);
  std::ostream::flush();
  lVar9 = 0;
  do {
    piVar1 = this->registerUsage + lVar9;
    *piVar1 = i;
    piVar1[1] = i;
    piVar1[2] = i;
    piVar1[3] = i;
    lVar9 = lVar9 + 4;
  } while (lVar9 != 8);
  return;
}

Assistant:

void AssemblyGeneratorX86::h_CBRANCH(Instruction& instr, int i) {
		int reg = instr.dst;
		int target = registerUsage[reg] + 1;
		int shift = instr.getModCond() + ConditionOffset;
		int32_t imm = instr.getImm32() | (1L << shift);
		if (ConditionOffset > 0 || shift > 0)
			imm &= ~(1L << (shift - 1));
		asmCode << "\tadd " << regR[reg] << ", " << imm << std::endl;
		asmCode << "\ttest " << regR[reg] << ", " << (ConditionMask << shift) << std::endl;
		asmCode << "\tjz defyx_isn_" << target << std::endl;
		//mark all registers as used
		for (unsigned j = 0; j < RegistersCount; ++j) {
			registerUsage[j] = i;
		}
	}